

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIndexManipulator.hpp
# Opt level: O0

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* __thiscall
TasGrid::MultiIndexManipulations::generateLevelWeightsCache<double,(TasGrid::TypeDepth)3,false>
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *__return_storage_ptr__,MultiIndexManipulations *this,ProperWeights *weights,
          function<int_(int)> *rule_exactness,int offset)

{
  size_t __n;
  const_reference pvVar1;
  const_reference pvVar2;
  reference pvVar3;
  double dVar4;
  double dVar5;
  reference pvVar6;
  int local_94;
  int e;
  double w;
  size_t i;
  double wc;
  size_type sStack_70;
  int wl;
  size_t j;
  undefined1 local_60 [8];
  vector<int,_std::allocator<int>_> exactness_cache;
  allocator<std::vector<double,_std::allocator<double>_>_> local_32;
  byte local_31;
  size_t local_30;
  size_t num_dimensions;
  ProperWeights *pPStack_20;
  int offset_local;
  function<int_(int)> *rule_exactness_local;
  ProperWeights *weights_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *cache;
  
  num_dimensions._4_4_ = (int)rule_exactness;
  pPStack_20 = weights;
  rule_exactness_local = (function<int_(int)> *)this;
  weights_local = (ProperWeights *)__return_storage_ptr__;
  __n = ProperWeights::getNumDimensions((ProperWeights *)this);
  local_31 = 0;
  local_30 = __n;
  ::std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(&local_32);
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)__return_storage_ptr__,__n,&local_32);
  ::std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator(&local_32);
  ::std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_60);
  j._4_4_ = 0;
  ::std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_60,(value_type_conflict3 *)((long)&j + 4));
  for (sStack_70 = 0; sStack_70 < local_30; sStack_70 = sStack_70 + 1) {
    pvVar1 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        ((long)&(rule_exactness_local->super__Function_base)._M_functor + 8),
                        sStack_70);
    wc._4_4_ = *pvVar1;
    pvVar2 = ::std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(rule_exactness_local + 1),
                        sStack_70);
    i = (size_t)*pvVar2;
    w = 0.0;
    _e = 1.0;
    pvVar3 = ::std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)__return_storage_ptr__,sStack_70);
    ::std::vector<double,_std::allocator<double>_>::push_back(pvVar3,(value_type_conflict2 *)&e);
    do {
      dVar4 = (double)((long)w + 1);
      w = dVar4;
      dVar5 = (double)::std::vector<int,_std::allocator<int>_>::size
                                ((vector<int,_std::allocator<int>_> *)local_60);
      if ((ulong)dVar5 <= (ulong)dVar4) {
        local_94 = ::std::function<int_(int)>::operator()
                             ((function<int_(int)> *)weights,w._0_4_ + -1);
        local_94 = local_94 + 1;
        ::std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_60,&local_94);
      }
      pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_60,(size_type)w);
      _e = pow((double)(*pvVar6 + 1),(double)i);
      pvVar3 = ::std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)__return_storage_ptr__,sStack_70);
      ::std::vector<double,_std::allocator<double>_>::push_back(pvVar3,(value_type_conflict2 *)&e);
      dVar4 = ceil(_e);
    } while (dVar4 <= (double)num_dimensions._4_4_);
  }
  local_31 = 1;
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_60);
  if ((local_31 & 1) == 0) {
    ::std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<CacheType>> generateLevelWeightsCache(ProperWeights const &weights, std::function<int(int i)> rule_exactness, int offset){
    size_t num_dimensions = weights.getNumDimensions();
    std::vector<std::vector<CacheType>> cache(num_dimensions);
    std::vector<int> exactness_cache;

    // if we know the sized here, then assign, otherwise dynamically build later
    if (isotropic){
        for(auto &vec : cache) vec.reserve((size_t) offset);
        exactness_cache.resize((size_t) offset);
        exactness_cache[0] = 0;
        for(int i=1; i<offset; i++)
            exactness_cache[i] = 1 + rule_exactness(i - 1);
    }else{
        exactness_cache.push_back(0); // exactness always starts from 0
    }

    for(size_t j=0; j<num_dimensions; j++){
        int wl = weights.linear[j]; // linear weights
        double wc = (contour == type_level) ? 0.0 : weights.curved[j]; // curved weights

        size_t i = 0; // keep track of the index
        CacheType w = (CacheType) ((contour == type_hyperbolic) ? 1 : 0);
        cache[j].push_back(w); // initial entry
        do{ // accumulate the cache
            i++;
            if (!isotropic && (i >= exactness_cache.size()))
                exactness_cache.push_back(1 + rule_exactness((int)(i - 1)));

            int e = exactness_cache[i];

            if (contour == type_level){
                w = (CacheType)(wl * e);
            }else if (contour == type_curved){
                w = (CacheType)(wl * e) + (CacheType)(wc * std::log1p((CacheType)e));
            }else{ // must be hyperbolic
                w = (CacheType)(pow((CacheType) (1 + e), wc));
            }

            cache[j].push_back(w);
        // isotropic mode works until offset, anisotropic mode works until weight reaches the offset
        }while( (!isotropic && (std::ceil(w) <= (CacheType) offset)) || (isotropic && (i + 1 < (size_t) offset)) );
    }

    return cache;
}